

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O2

void __thiscall
Iir::PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
          (PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8> *this)

{
  CascadeStages<4,_Iir::DirectFormII> *this_00;
  Layout<8> *this_01;
  Layout<8> *this_02;
  Storage local_30;
  
  PoleFilterBase<Iir::Butterworth::AnalogLowPass>::PoleFilterBase
            ((PoleFilterBase<Iir::Butterworth::AnalogLowPass> *)this);
  this_00 = &this->super_CascadeStages<4,_Iir::DirectFormII>;
  CascadeStages<4,_Iir::DirectFormII>::CascadeStages(this_00);
  this_01 = &this->m_analogStorage;
  memset(this_01,0,0x100);
  Layout<8>::Layout(this_01);
  this_02 = &this->m_digitalStorage;
  memset(this_02,0,0x100);
  Layout<8>::Layout(this_02);
  local_30.maxStages = 4;
  local_30.stageArray = this_00->m_stages;
  Cascade::setCascadeStorage((Cascade *)this,&local_30);
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_numPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_maxPoles = 8;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_pair = this_01->m_pairs;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_numPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_maxPoles = 8;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_pair = this_02->m_pairs;
  *(undefined4 *)
   &(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalW = 0;
  *(undefined4 *)
   ((long)&(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalW + 4) = 0;
  *(undefined4 *)
   &(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalGain = 0;
  *(undefined4 *)
   ((long)&(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalGain + 4) = 0x3ff00000;
  CascadeStages<4,_Iir::DirectFormII>::reset(this_00);
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}